

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

Variable __thiscall LiteScript::CreateVariable(LiteScript *this,Memory *memory,char *value)

{
  Object *pOVar1;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar2;
  Variable VVar3;
  String local_30;
  
  Memory::Create((Memory *)this,(Type *)memory);
  String::String(&local_30,value);
  pOVar1 = Variable::operator->((Variable *)this);
  String::operator=((String *)pOVar1->data,&local_30);
  puVar2 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_30.str._M_dataplus._M_p != &local_30.str.field_2) {
    operator_delete(local_30.str._M_dataplus._M_p);
    puVar2 = extraout_RDX_00;
  }
  VVar3.nb_ref = puVar2;
  VVar3.obj = (Object *)this;
  return VVar3;
}

Assistant:

LiteScript::Variable LiteScript::CreateVariable(Memory &memory, const char *value) {
    Variable v = memory.Create(Type::STRING);
    v->GetData<String>() = String(value);
    return v;
}